

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O0

bool CheckRelativePath(string *local,string *remote,string *expected)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_48 [8];
  string result;
  string *expected_local;
  string *remote_local;
  string *local_local;
  
  result.field_2._8_8_ = expected;
  cmsys::SystemTools::RelativePath((string *)local_48,local,remote);
  bVar1 = cmsys::SystemTools::ComparePath((string *)result.field_2._8_8_,(string *)local_48);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"RelativePath(");
    poVar2 = std::operator<<(poVar2,(string *)local);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,(string *)remote);
    poVar2 = std::operator<<(poVar2,")  yielded ");
    poVar2 = std::operator<<(poVar2,(string *)local_48);
    poVar2 = std::operator<<(poVar2," instead of ");
    poVar2 = std::operator<<(poVar2,(string *)result.field_2._8_8_);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)local_48);
  return bVar1;
}

Assistant:

static bool CheckRelativePath(const std::string& local,
                              const std::string& remote,
                              const std::string& expected)
{
  std::string result = kwsys::SystemTools::RelativePath(local, remote);
  if (!kwsys::SystemTools::ComparePath(expected, result)) {
    std::cerr << "RelativePath(" << local << ", " << remote << ")  yielded "
              << result << " instead of " << expected << std::endl;
    return false;
  }
  return true;
}